

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

unsigned_long bn_sub_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  int save_dl;
  unsigned_long t;
  unsigned_long c;
  ulong local_30;
  int local_28;
  ulong *local_20;
  ulong *local_18;
  ulong *local_10;
  
  local_30 = bn_sub_words(in_RDI,in_RSI,in_RDX,in_ECX);
  if (in_R8D == 0) {
    return local_30;
  }
  local_10 = in_RDI + in_ECX;
  local_18 = in_RSI + in_ECX;
  local_20 = in_RDX + in_ECX;
  local_28 = in_R8D;
  if (in_R8D < 0) {
    while( true ) {
      uVar1 = *local_20;
      *local_10 = -local_30 - uVar1;
      if (uVar1 != 0) {
        local_30 = 1;
      }
      if (-1 < local_28 + 1) {
        return local_30;
      }
      uVar1 = local_20[1];
      local_10[1] = -local_30 - uVar1;
      if (uVar1 != 0) {
        local_30 = 1;
      }
      if (-1 < local_28 + 2) break;
      uVar1 = local_20[2];
      local_10[2] = -local_30 - uVar1;
      if (uVar1 != 0) {
        local_30 = 1;
      }
      if (-1 < local_28 + 3) {
        return local_30;
      }
      uVar1 = local_20[3];
      local_10[3] = -local_30 - uVar1;
      if (uVar1 != 0) {
        local_30 = 1;
      }
      local_28 = local_28 + 4;
      if (-1 < local_28) {
        return local_30;
      }
      local_20 = local_20 + 4;
      local_10 = local_10 + 4;
    }
    return local_30;
  }
  while (iVar3 = local_28, iVar2 = local_28, local_30 != 0) {
    uVar1 = *local_18;
    *local_10 = uVar1 - local_30;
    if (uVar1 != 0) {
      local_30 = 0;
    }
    iVar2 = local_28 + -1;
    if (local_28 + -1 < 1) break;
    uVar1 = local_18[1];
    local_10[1] = uVar1 - local_30;
    if (uVar1 != 0) {
      local_30 = 0;
    }
    iVar2 = local_28 + -2;
    if (local_28 + -2 < 1) break;
    uVar1 = local_18[2];
    local_10[2] = uVar1 - local_30;
    if (uVar1 != 0) {
      local_30 = 0;
    }
    iVar2 = local_28 + -3;
    if (local_28 + -3 < 1) break;
    uVar1 = local_18[3];
    local_10[3] = uVar1 - local_30;
    if (uVar1 != 0) {
      local_30 = 0;
    }
    local_28 = local_28 + -4;
    iVar2 = local_28;
    if (local_28 < 1) break;
    local_18 = local_18 + 4;
    local_10 = local_10 + 4;
  }
  local_28 = iVar2;
  if ((local_28 < 1) || (iVar3 <= local_28)) goto LAB_001186c3;
  iVar3 = iVar3 - local_28;
  if (iVar3 == 1) {
    local_10[1] = local_18[1];
    local_28 = local_28 + -1;
    if (0 < local_28) goto LAB_00118659;
  }
  else {
    if (iVar3 == 2) {
LAB_00118659:
      local_10[2] = local_18[2];
      local_28 = local_28 + -1;
      if (local_28 < 1) goto LAB_001186a5;
    }
    else if (iVar3 != 3) goto LAB_001186a5;
    local_10[3] = local_18[3];
    local_28 = local_28 + -1;
  }
LAB_001186a5:
  local_18 = local_18 + 4;
  local_10 = local_10 + 4;
LAB_001186c3:
  if (0 < local_28) {
    while (((*local_10 = *local_18, 0 < local_28 + -1 &&
            (local_10[1] = local_18[1], 0 < local_28 + -2)) &&
           (local_10[2] = local_18[2], 0 < local_28 + -3))) {
      local_10[3] = local_18[3];
      local_28 = local_28 + -4;
      if (local_28 < 1) {
        return local_30;
      }
      local_18 = local_18 + 4;
      local_10 = local_10 + 4;
    }
  }
  return local_30;
}

Assistant:

BN_ULONG bn_sub_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, t;

    assert(cl >= 0);
    c = bn_sub_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        for (;;) {
            t = b[0];
            r[0] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[1];
            r[1] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[2];
            r[2] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[3];
            r[3] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            b += 4;
            r += 4;
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = a[0];
            r[0] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[1];
            r[1] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[2];
            r[2] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[3];
            r[3] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}